

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

PolymorphicMatcher<testing::internal::MatchesRegexMatcher> * __thiscall
testing::ContainsRegex<char_const*>
          (PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *__return_storage_ptr__,
          testing *this,StringLike<const_char_*> *regex)

{
  RE *this_00;
  allocator<char> local_59;
  RE *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_48;
  long *local_40 [2];
  long local_30 [2];
  
  this_00 = (RE *)operator_new(0x90);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,*(char **)this,&local_59);
  internal::RE::Init(this_00,(char *)local_40[0]);
  local_58 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<testing::internal::RE_const*>
            (&local_50,this_00);
  local_48 = 0;
  (__return_storage_ptr__->impl_).regex_.
  super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
  (__return_storage_ptr__->impl_).regex_.
  super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_50._M_pi;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
    }
  }
  (__return_storage_ptr__->impl_).full_match_ = false;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

PolymorphicMatcher<internal::MatchesRegexMatcher> ContainsRegex(
    const internal::StringLike<T>& regex) {
  return ContainsRegex(new internal::RE(std::string(regex)));
}